

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O1

bool __thiscall depspawn::internal::arg_info::is_contained_array(arg_info *this,arg_info *other)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (uint)this->rank;
  do {
    uVar2 = 0;
    if ('\0' < this->rank) {
      uVar2 = 0;
      do {
        if ((this->array_range[uVar2].first < other->array_range[uVar2].first) ||
           (other->array_range[uVar2].second < this->array_range[uVar2].second)) goto LAB_0010bb64;
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
      uVar2 = (ulong)uVar1;
    }
LAB_0010bb64:
    if ((((uint)uVar2 == uVar1) || (other = other->next, other == (arg_info *)0x0)) ||
       (this->addr != other->addr)) {
      return (uint)uVar2 == uVar1;
    }
  } while( true );
}

Assistant:

bool arg_info::is_contained_array(const arg_info *other) const
    { int i;
      
      const int lim = rank;
      
      do {

          assert(lim == other->rank);
          
          for(i = 0; i < lim; i++) {
            if(!contains_intervals(std::get<0>(other->array_range[i]), std::get<1>(other->array_range[i]),
                                   std::get<0>(array_range[i]), std::get<1>(array_range[i])))
              break;
          }
          
          if(i == lim) {
            //if(depspawn::debug) std::cout << "DEP FOUND\n";
            return true;
          }

 
        other = other->next;

      } while(other && (addr == other->addr));
      
      return false;
    }